

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_net.cpp
# Opt level: O0

double __thiscall Net::derivative_function(Net *this,double x)

{
  FUNCTIONS FVar1;
  double local_20;
  double x_local;
  Net *this_local;
  
  FVar1 = this->function_type;
  local_20 = x;
  x_local = (double)this;
  if (FVar1 == SIGMOID) {
    this_local = (Net *)sigmoid_derivative(&local_20);
  }
  else if (FVar1 == TANH) {
    this_local = (Net *)hyp_tan_derivative(&local_20);
  }
  else if (FVar1 == RELU) {
    this_local = (Net *)ReLU_derivative(&local_20);
  }
  else {
    this_local = (Net *)0x0;
  }
  return (double)this_local;
}

Assistant:

double Net::derivative_function(double x){
    switch (function_type) {
        case SIGMOID:
            return sigmoid_derivative(x);
        case TANH:
            return hyp_tan_derivative(x);
        case RELU:
            return ReLU_derivative(x);
    }
    return 0;
}